

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O3

bool __thiscall
ReplaceExtraCompilerCacheKey::operator==
          (ReplaceExtraCompilerCacheKey *this,ReplaceExtraCompilerCacheKey *f)

{
  ReplaceFor RVar1;
  long lVar2;
  char cVar3;
  undefined1 uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  QStringView QVar9;
  QStringView QVar10;
  QStringView QVar11;
  QStringView QVar12;
  QStringView QVar13;
  QStringView QVar14;
  QStringView QVar15;
  QStringView QVar16;
  QStringView QVar17;
  QStringView QVar18;
  QStringView QVar19;
  QStringView QVar20;
  QStringView QVar21;
  QStringView QVar22;
  
  uVar5 = this->hash;
  if (uVar5 == 0) {
    RVar1 = this->forShell;
    QVar9.m_data = (this->var).d.ptr;
    QVar9.m_size = (this->var).d.size;
    uVar5 = qHash(QVar9,0);
    QVar10.m_data = (this->in).d.ptr;
    QVar10.m_size = (this->in).d.size;
    uVar6 = qHash(QVar10,0);
    QVar11.m_data = (this->out).d.ptr;
    QVar11.m_size = (this->out).d.size;
    uVar7 = qHash(QVar11,0);
    uVar5 = uVar7 ^ uVar6 ^ uVar5 ^ RVar1;
    this->hash = uVar5;
  }
  uVar6 = f->hash;
  if (uVar6 == 0) {
    RVar1 = f->forShell;
    QVar12.m_data = (f->var).d.ptr;
    QVar12.m_size = (f->var).d.size;
    uVar6 = qHash(QVar12,0);
    QVar13.m_data = (f->in).d.ptr;
    QVar13.m_size = (f->in).d.size;
    uVar7 = qHash(QVar13,0);
    QVar14.m_data = (f->out).d.ptr;
    QVar14.m_size = (f->out).d.size;
    uVar8 = qHash(QVar14,0);
    uVar6 = uVar8 ^ uVar7 ^ uVar6 ^ RVar1;
    f->hash = uVar6;
  }
  if (((uVar5 == uVar6) && (f->forShell == this->forShell)) &&
     (lVar2 = (f->in).d.size, lVar2 == (this->in).d.size)) {
    QVar15.m_data = (f->in).d.ptr;
    QVar15.m_size = lVar2;
    QVar19.m_data = (this->in).d.ptr;
    QVar19.m_size = lVar2;
    cVar3 = QtPrivate::equalStrings(QVar15,QVar19);
    if ((cVar3 != '\0') && (lVar2 = (f->out).d.size, lVar2 == (this->out).d.size)) {
      QVar16.m_data = (f->out).d.ptr;
      QVar16.m_size = lVar2;
      QVar20.m_data = (this->out).d.ptr;
      QVar20.m_size = lVar2;
      cVar3 = QtPrivate::equalStrings(QVar16,QVar20);
      if ((cVar3 != '\0') && (lVar2 = (f->var).d.size, lVar2 == (this->var).d.size)) {
        QVar17.m_data = (f->var).d.ptr;
        QVar17.m_size = lVar2;
        QVar21.m_data = (this->var).d.ptr;
        QVar21.m_size = lVar2;
        cVar3 = QtPrivate::equalStrings(QVar17,QVar21);
        if ((cVar3 != '\0') && (lVar2 = (f->pwd).d.size, lVar2 == (this->pwd).d.size)) {
          QVar18.m_data = (f->pwd).d.ptr;
          QVar18.m_size = lVar2;
          QVar22.m_data = (this->pwd).d.ptr;
          QVar22.m_size = lVar2;
          uVar4 = QtPrivate::equalStrings(QVar18,QVar22);
          return (bool)uVar4;
        }
      }
    }
  }
  return false;
}

Assistant:

bool ReplaceExtraCompilerCacheKey::operator==(const ReplaceExtraCompilerCacheKey &f) const
{
    return (hashCode() == f.hashCode() &&
            f.forShell == forShell &&
            f.in == in &&
            f.out == out &&
            f.var == var &&
            f.pwd == pwd);
}